

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateSerializationCode
          (EnumFieldGenerator *this,Printer *printer)

{
  char *pcVar1;
  
  if ((*(int *)(this->descriptor_ + 0x4c) == 2) &&
     (((this->super_FieldGenerator).params_)->generate_has_ != true)) {
    pcVar1 = "output.writeInt32($number$, this.$name$);\n";
  }
  else {
    pcVar1 = "if (this.$name$ != $default$) {\n";
    if (((this->super_FieldGenerator).params_)->generate_has_ != false) {
      pcVar1 = "if (this.$name$ != $default$ || has$capitalized_name$) {\n";
    }
    io::Printer::Print(printer,&this->variables_,pcVar1);
    pcVar1 = "  output.writeInt32($number$, this.$name$);\n}\n";
  }
  io::Printer::Print(printer,&this->variables_,pcVar1);
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->is_required() && !params_.generate_has()) {
    // Always serialize a required field if we don't have the 'has' signal.
    printer->Print(variables_,
      "output.writeInt32($number$, this.$name$);\n");
  } else {
    if (params_.generate_has()) {
      printer->Print(variables_,
        "if (this.$name$ != $default$ || has$capitalized_name$) {\n");
    } else {
      printer->Print(variables_,
        "if (this.$name$ != $default$) {\n");
    }
    printer->Print(variables_,
      "  output.writeInt32($number$, this.$name$);\n"
      "}\n");
  }
}